

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

char * TR_VarDec(ast *node,int *size)

{
  char *pcVar1;
  attr *a;
  char *__s;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Elt_pointer piVar4;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [80];
  _Alloc_hider local_68;
  char local_58 [16];
  key_type local_48;
  
  do {
    node = child(node,1);
  } while (node->type != 0x11c);
  a = findvar(node->lex);
  IrSim::newVar((Operand *)local_b8,&irSim);
  __s = strdup((char *)local_b8._8_8_);
  if ((undefined1 *)local_b8._8_8_ != local_b8 + 0x18) {
    operator_delete((void *)local_b8._8_8_);
  }
  if (a->kind == 0) {
    std::__cxx11::string::string((string *)local_b8,node->lex,(allocator *)&local_d8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&basics_abi_cxx11_,(key_type *)local_b8);
    pcVar1 = (char *)pmVar3->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,(ulong)__s);
  }
  else {
    if (a->kind != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                    ,0x26d,"const char *TR_VarDec(ast *, int *)");
    }
    std::__cxx11::string::string((string *)&local_d8,__s,&local_d9);
    Array::Array((Array *)local_b8,&local_d8,a);
    std::__cxx11::string::string((string *)&local_48,node->lex,&local_da);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
             ::operator[](&arrays_abi_cxx11_,&local_48);
    std::deque<int,_std::allocator<int>_>::_M_move_assign1(&pmVar2->directSize,local_b8);
    std::__cxx11::string::operator=((string *)&pmVar2->newName,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (local_68._M_p != local_58) {
      operator_delete(local_68._M_p);
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (size == (int *)0x0) {
      return __s;
    }
    std::__cxx11::string::string((string *)local_b8,node->lex,(allocator *)&local_d8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
             ::operator[](&arrays_abi_cxx11_,(key_type *)local_b8);
    piVar4 = (pmVar2->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar4 == (pmVar2->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar4 = (pmVar2->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    *size = piVar4[-1];
  }
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_);
  }
  return __s;
}

Assistant:

static const char *TR_VarDec(ast *node, int *size) {
    ast *c1 = child(node, 1);
    while (c1->type != ID) c1 = child(c1, 1);
    attr *a = findvar(c1->lex);
    const char *name = strdup(irSim.newVar().value.c_str());
    if (a->kind == ARRAY) {
        arrays[c1->lex] = Array(name, a);
        if (size) *size = arrays[c1->lex].getSize();
    }
    else if (a->kind == BASIC) basics[c1->lex] = name;
    else assert(false);
    return name;
}